

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exactfloat.cc
# Opt level: O1

double frexp(double __x,int *__exponent)

{
  undefined4 extraout_EAX;
  undefined4 *in_RDX;
  ExactFloat *in_RSI;
  double dVar1;
  double extraout_XMM0_Qa;
  
  if (in_RSI->bn_exp_ < 0x7ffffffd) {
    dVar1 = ExactFloat::exp(in_RSI,__x);
    *in_RDX = extraout_EAX;
    dVar1 = ExactFloat::exp(in_RSI,dVar1);
    dVar1 = ldexp(dVar1,(int)__exponent);
  }
  else {
    *in_RDX = 0;
    ExactFloat::ExactFloat((ExactFloat *)__exponent,in_RSI);
    dVar1 = extraout_XMM0_Qa;
  }
  return dVar1;
}

Assistant:

ExactFloat frexp(const ExactFloat& a, int* exp) {
  if (!a.is_normal()) {
    // If a == 0, exp should be zero.  If a.is_inf() or a.is_nan(), exp is not
    // defined but the glibc implementation returns zero.
    *exp = 0;
    return a;
  }
  *exp = a.exp();
  return ldexp(a, -a.exp());
}